

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_program.c
# Opt level: O0

int set_bidder_signature
              (archive_read_filter_bidder *bidder,program_bidder *state,void *signature,
              size_t signature_len)

{
  void *pvVar1;
  size_t signature_len_local;
  void *signature_local;
  program_bidder *state_local;
  archive_read_filter_bidder *bidder_local;
  
  if ((signature != (void *)0x0) && (signature_len != 0)) {
    state->signature_len = signature_len;
    pvVar1 = malloc(signature_len);
    state->signature = pvVar1;
    memcpy(state->signature,signature,signature_len);
  }
  bidder->data = state;
  bidder->bid = program_bidder_bid;
  bidder->init = program_bidder_init;
  bidder->options = (_func_int_archive_read_filter_bidder_ptr_char_ptr_char_ptr *)0x0;
  bidder->free = program_bidder_free;
  return 0;
}

Assistant:

static int
set_bidder_signature(struct archive_read_filter_bidder *bidder,
    struct program_bidder *state, const void *signature, size_t signature_len)
{

	if (signature != NULL && signature_len > 0) {
		state->signature_len = signature_len;
		state->signature = malloc(signature_len);
		memcpy(state->signature, signature, signature_len);
	}

	/*
	 * Fill in the bidder object.
	 */
	bidder->data = state;
	bidder->bid = program_bidder_bid;
	bidder->init = program_bidder_init;
	bidder->options = NULL;
	bidder->free = program_bidder_free;
	return (ARCHIVE_OK);
}